

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CWhileStm *stm)

{
  initializer_list<INode_*> __l;
  allocator_type local_a1;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_a0;
  _Head_base<0UL,_IExpression_*,_false> local_88;
  IStatement *pIStack_80;
  string local_78;
  vector<INode_*,_std::allocator<INode_*>_> children;
  ChildrenAnswers local_40;
  
  local_88._M_head_impl =
       (stm->conditionExpression)._M_t.
       super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
       super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
       super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  pIStack_80 = (stm->statement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_88;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_a1);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_a0,&children);
  VisitChildren(&local_40,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_a0);
  AddChildrenAnswers(this,&local_40);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_40);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_a0);
  std::__cxx11::string::string((string *)&local_78,"WhileStm",(allocator *)&local_88);
  AddLabel(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this->lastVisited = this->lastVisited + 1;
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CWhileStm &stm) {
	std::vector<INode*> children = { stm.conditionExpression.get(), stm.statement.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("WhileStm");
	++lastVisited;
}